

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionFixture::createSession
          (sessionFixture *this,int heartBtInt,int startDay,int endDay)

{
  Session *this_00;
  allocator<char> local_714;
  allocator<char> local_713;
  allocator<char> local_712;
  allocator<char> local_711;
  STRING local_710;
  string local_6f0;
  STRING local_6d0;
  STRING local_6b0;
  FieldBase local_690;
  TimeRange sessionTime;
  string local_620 [2];
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"FIX.4.2",&local_711);
  FIX::BeginString::BeginString((BeginString *)&provider,&local_710);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"TW",&local_712);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&sessionTime,&local_6b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"ISLD",&local_713);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_690,&local_6d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"",&local_714);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,local_620,&local_690.m_string,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  FIX::FieldBase::~FieldBase(&local_690);
  std::__cxx11::string::~string((string *)&local_6d0);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionTime);
  std::__cxx11::string::~string((string *)&local_6b0);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&local_710);
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"../spec/FIX42.xml",(allocator<char> *)&local_710);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  this_00 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (this_00,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,&sessionID,&provider,&sessionTime,heartBtInt,
             (LogFactory *)0x0);
  this->object = this_00;
  FIX::Session::setResponder(this_00,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIX.4.2" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX42.xml" );
    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setResponder( this );
  }